

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.h
# Opt level: O0

void __thiscall cfd::core::TxIn::TxIn(TxIn *this,TxIn *param_2)

{
  undefined8 *in_RDI;
  
  AbstractTxIn::AbstractTxIn(&this->super_AbstractTxIn,&param_2->super_AbstractTxIn);
  *in_RDI = &PTR__TxIn_0057e480;
  return;
}

Assistant:

class CFD_CORE_EXPORT TxIn : public AbstractTxIn {
 public:
  /**
   * @brief Minimum TxIn size
   * @details txid(32), vout(4), sequence(4), scriptLength(1)
   */
  static constexpr const size_t kMinimumTxInSize = 41;

  /**
   * @brief estimate txin's size, and witness size.
   * @param[in] addr_type         address type
   * @param[in] redeem_script     redeem script
   * @param[out] witness_area_size     witness area size
   * @param[out] no_witness_area_size  no witness area size
   * @param[in] scriptsig_template     scriptsig template
   * @return TxIn size.
   */
  static uint32_t EstimateTxInSize(
      AddressType addr_type, Script redeem_script = Script(),
      uint32_t* witness_area_size = nullptr,
      uint32_t* no_witness_area_size = nullptr,
      const Script* scriptsig_template = nullptr);

  /**
   * @brief estimate txin's virtual size direct.
   * @param[in] addr_type           address type
   * @param[in] redeem_script       redeem script
   * @param[in] scriptsig_template  scriptsig template
   * @return TxIn virtual size.
   */
  static uint32_t EstimateTxInVsize(
      AddressType addr_type, Script redeem_script = Script(),
      const Script* scriptsig_template = nullptr);

  /**
   * @brief constructor.
   * @param[in] txid        txid
   * @param[in] index       tx output index(vout)
   * @param[in] sequence    sequence
   */
  TxIn(const Txid& txid, uint32_t index, uint32_t sequence);
  /**
   * @brief constructor.
   * @param[in] txid              txid
   * @param[in] index       tx output index(vout)
   * @param[in] sequence          sequence
   * @param[in] unlocking_script  unlocking script
   */
  TxIn(
      const Txid& txid, uint32_t index, uint32_t sequence,
      const Script& unlocking_script);
  /**
   * @brief destructor
   */
  virtual ~TxIn() {
    // do nothing
  }
}